

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_array.h
# Opt level: O1

iterator __thiscall
re2::SparseArray<re2::NFA::Thread_*>::find(SparseArray<re2::NFA::Thread_*> *this,int i)

{
  SparseArray<re2::NFA::Thread_*> *pSVar1;
  
  if (i < 0) {
    __assert_fail("(i) >= (0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/util/sparse_array.h"
                  ,0x134,
                  "bool re2::SparseArray<re2::NFA::Thread *>::has_index(int) const [Value = re2::NFA::Thread *]"
                 );
  }
  if (i < this->max_size_) {
    pSVar1 = this;
    if ((uint)i < (uint)this->max_size_) {
      if (((uint)this->sparse_to_dense_[(uint)i] < (uint)this->size_) &&
         ((this->dense_).
          super__Vector_base<re2::SparseArray<re2::NFA::Thread_*>::IndexValue,_std::allocator<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>_>
          ._M_impl.super__Vector_impl_data._M_start[this->sparse_to_dense_[(uint)i]].index_ == i)) {
        pSVar1 = (SparseArray<re2::NFA::Thread_*> *)(this->sparse_to_dense_ + (uint)i);
      }
    }
    return (iterator)
           ((this->dense_).
            super__Vector_base<re2::SparseArray<re2::NFA::Thread_*>::IndexValue,_std::allocator<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>_>
            ._M_impl.super__Vector_impl_data._M_start + pSVar1->size_);
  }
  __assert_fail("(i) < (max_size_)",
                "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/util/sparse_array.h"
                ,0x135,
                "bool re2::SparseArray<re2::NFA::Thread *>::has_index(int) const [Value = re2::NFA::Thread *]"
               );
}

Assistant:

typename SparseArray<Value>::iterator SparseArray<Value>::find(int i) {
  if (has_index(i))
    return dense_.begin() + sparse_to_dense_[i];
  return end();
}